

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringConst(TranslateToFuzzReader *this)

{
  Random *this_00;
  char cVar1;
  char cVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Expression *pEVar5;
  uint32_t uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  Expression EVar11;
  stringstream local_368 [8];
  stringstream wtf8;
  ostream local_358 [112];
  ios_base aiStack_2e8 [264];
  long *local_1e0;
  stringstream wtf16;
  undefined4 uStack_1d4;
  long local_1d0 [14];
  ios_base aiStack_160 [264];
  TranslateToFuzzReader *local_58;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  std::__cxx11::stringstream::stringstream(local_368);
  this_00 = &this->random;
  local_58 = this;
  uVar3 = Random::upTo(this_00,4);
  if (uVar3 != 0) {
    bVar10 = false;
    uVar9 = 0;
    do {
      uVar4 = Random::upTo(this_00,6);
      switch(uVar4) {
      case 0:
        uVar4 = Random::upTo(this_00,0x400);
        cVar2 = '\x01';
        if (9 < uVar4) {
          uVar6 = uVar4;
          cVar1 = '\x04';
          do {
            cVar2 = cVar1;
            if (uVar6 < 100) {
              cVar2 = cVar2 + -2;
              goto LAB_00145f6d;
            }
            if (uVar6 < 1000) {
              cVar2 = cVar2 + -1;
              goto LAB_00145f6d;
            }
            if (uVar6 < 10000) goto LAB_00145f6d;
            bVar10 = 99999 < uVar6;
            uVar6 = uVar6 / 10000;
            cVar1 = cVar2 + '\x04';
          } while (bVar10);
          cVar2 = cVar2 + '\x01';
        }
LAB_00145f6d:
        local_1e0 = local_1d0;
        std::__cxx11::string::_M_construct((ulong)&local_1e0,cVar2);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0,_wtf16,uVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_358,(char *)local_1e0,CONCAT44(uStack_1d4,_wtf16));
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        goto switchD_00145e85_default;
      case 1:
        lVar7 = 2;
        pcVar8 = anon_var_dwarf_b8536;
        break;
      case 2:
        lVar7 = 3;
        pcVar8 = anon_var_dwarf_b8551;
        break;
      case 3:
        lVar7 = 4;
        pcVar8 = anon_var_dwarf_b855e;
        break;
      case 4:
        bVar10 = true;
        std::__ostream_insert<char,std::char_traits<char>>(local_358,anon_var_dwarf_b856b,3);
        goto LAB_00145f58;
      case 5:
        lVar7 = 3;
        pcVar8 = anon_var_dwarf_b8578;
        if (!bVar10) break;
        goto LAB_00145f58;
      default:
        goto switchD_00145e85_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_358,pcVar8,lVar7);
switchD_00145e85_default:
      bVar10 = false;
LAB_00145f58:
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar3);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1e0);
  std::__cxx11::stringbuf::str();
  wasm::String::convertWTF8ToWTF16(local_1d0,local_48,local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  EVar11 = (Expression)wasm::IString::interned(local_48,local_50,0);
  pEVar5 = (Expression *)MixedArena::allocSpace(&((local_58->builder).wasm)->allocator,0x20,8);
  pEVar5->_id = StringConstId;
  (pEVar5->type).id = 0;
  *(undefined8 *)(pEVar5 + 1) = 0;
  pEVar5[1] = EVar11;
  wasm::StringConst::finalize();
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1e0);
  std::ios_base::~ios_base(aiStack_160);
  std::__cxx11::stringstream::~stringstream(local_368);
  std::ios_base::~ios_base(aiStack_2e8);
  return pEVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringConst() {
  // Construct an interesting WTF-8 string from parts and use string.const.
  std::stringstream wtf8;
  bool lastWasLeadingSurrogate = false;
  for (size_t i = 0, end = upTo(4); i < end; ++i) {
    switch (upTo(6)) {
      case 0:
        // A simple ascii string.
        wtf8 << std::to_string(upTo(1024));
        break;
      case 1:
        // '£'
        wtf8 << "\xC2\xA3";
        break;
      case 2:
        // '€'
        wtf8 << "\xE2\x82\xAC";
        break;
      case 3:
        // '𐍈'
        wtf8 << "\xF0\x90\x8D\x88";
        break;
      case 4:
        // The leading surrogate in '𐍈'
        wtf8 << "\xED\xA0\x80";
        lastWasLeadingSurrogate = true;
        continue;
      case 5:
        if (lastWasLeadingSurrogate) {
          // Avoid invalid WTF-8.
          continue;
        }
        // The trailing surrogate in '𐍈'
        wtf8 << "\xED\xBD\x88";
        break;
    }
    lastWasLeadingSurrogate = false;
  }
  std::stringstream wtf16;
  // TODO: Use wtf16.view() once we have C++20.
  String::convertWTF8ToWTF16(wtf16, wtf8.str());
  return builder.makeStringConst(wtf16.str());
}